

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O3

void __thiscall
pbrt::GaussianFilter::GaussianFilter
          (GaussianFilter *this,Vector2f *radius,Float sigma,Allocator alloc)

{
  int iVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  FilterHandle local_20;
  
  (this->radius).super_Tuple2<pbrt::Vector2,_float> = radius->super_Tuple2<pbrt::Vector2,_float>;
  this->sigma = sigma;
  fVar2 = (radius->super_Tuple2<pbrt::Vector2,_float>).x;
  fVar8 = sigma * 6.2831855 * sigma;
  if (fVar8 < 0.0) {
    fVar7 = sqrtf(fVar8);
  }
  else {
    auVar4 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
    fVar7 = auVar4._0_4_;
  }
  fVar6 = 0.0;
  fVar3 = (sigma + sigma) * sigma;
  fVar2 = ((fVar2 * fVar2) / fVar3) * -1.442695;
  auVar4 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  fVar2 = fVar2 - auVar4._0_4_;
  auVar5 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3e679a0b),0),ZEXT416((uint)fVar2),
                           SUB6416(ZEXT464(0x3da00ac9),0));
  auVar5 = vfmadd213ss_fma(auVar5,ZEXT416((uint)fVar2),ZEXT416(0x3f321004));
  auVar5 = vfmadd213ss_fma(auVar5,ZEXT416((uint)fVar2),ZEXT416(0x3f800000));
  iVar1 = (int)auVar4._0_4_ + -0x7f + (auVar5._0_4_ >> 0x17);
  if (-0x7f < iVar1) {
    if (iVar1 < 0x80) {
      fVar6 = (float)(iVar1 * 0x800000 + 0x3f800000U | auVar5._0_4_ & 0x807fffff);
    }
    else {
      fVar6 = INFINITY;
    }
  }
  this->expX = (1.0 / fVar7) * fVar6;
  fVar2 = (radius->super_Tuple2<pbrt::Vector2,_float>).y;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    auVar4 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
    fVar8 = auVar4._0_4_;
  }
  fVar7 = 0.0;
  fVar2 = ((fVar2 * fVar2) / fVar3) * -1.442695;
  auVar4 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  fVar2 = fVar2 - auVar4._0_4_;
  auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar2),ZEXT416(0x3e679a0b));
  auVar5 = vfmadd213ss_fma(auVar5,ZEXT416((uint)fVar2),ZEXT416(0x3f321004));
  auVar5 = vfmadd213ss_fma(auVar5,ZEXT416((uint)fVar2),ZEXT416(0x3f800000));
  iVar1 = (int)auVar4._0_4_ + -0x7f + (auVar5._0_4_ >> 0x17);
  if (-0x7f < iVar1) {
    if (iVar1 < 0x80) {
      fVar7 = (float)(iVar1 * 0x800000 + 0x3f800000U | auVar5._0_4_ & 0x807fffff);
    }
    else {
      fVar7 = INFINITY;
    }
  }
  this->expY = (1.0 / fVar8) * fVar7;
  local_20.
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = (TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
           )((ulong)this | 0x2000000000000);
  FilterSampler::FilterSampler(&this->sampler,&local_20,alloc);
  return;
}

Assistant:

GaussianFilter(const Vector2f &radius, Float sigma = 0.5f, Allocator alloc = {})
        : radius(radius),
          sigma(sigma),
          expX(Gaussian(radius.x, 0, sigma)),
          expY(Gaussian(radius.y, 0, sigma)),
          sampler(this, alloc) {}